

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void Parser::ERROR(int line,string *type,string *sgn)

{
  string o;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [8];
  string local_188 [368];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string((string *)&local_260,"",(allocator *)&local_240);
  std::__cxx11::stringbuf::str(local_188);
  std::__cxx11::string::~string((string *)&local_260);
  std::ostream::operator<<(local_190,line);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)local_1a0,(string *)&local_260);
  std::operator+(&local_220,"Error at Line ",&local_260);
  std::operator+(&local_200,&local_220,": can\'t select ");
  std::operator+(&local_1e0,&local_200,type);
  std::operator+(&local_1c0,&local_1e0," from ");
  std::operator+(&local_240,&local_1c0,sgn);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errVec_abi_cxx11_
             ,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void ERROR(int line,string type,string sgn){
        stringstream ss;
        ss.str("");
        ss << line;
        string o;
        ss >> o;
        errVec.push_back("Error at Line "+o+": can't select "+type+" from "+sgn);
    }